

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void queue_master_msg(EVmaster master,void *vmsg,EVmaster_msg_type msg_type,CMConnection conn,
                     int copy)

{
  uint *puVar1;
  long *plVar2;
  void *pvVar3;
  char *pcVar4;
  undefined8 in_RCX;
  uint in_EDX;
  uint *in_RSI;
  long *in_RDI;
  int in_R8D;
  CManager_conflict unaff_retaddr;
  EVmaster_msg_ptr last;
  int i_1;
  EVflush_attrs_reconfig_ptr in_4;
  EVconn_shutdown_ptr in_3;
  EVshutdown_contribution_ptr in_2;
  EVdeploy_ack_ptr in_1;
  leaf_element *l_1;
  leaf_element *l;
  int i;
  EVnode_join_ptr in;
  EVmaster_msg_ptr msg;
  char *local_a8;
  CManager_conflict in_stack_ffffffffffffff60;
  char *local_98;
  char *local_90;
  long local_80;
  int local_74;
  int local_3c;
  
  puVar1 = (uint *)INT_CMmalloc((size_t)in_stack_ffffffffffffff60);
  *puVar1 = in_EDX;
  *(undefined8 *)(puVar1 + 2) = in_RCX;
  switch(in_EDX) {
  case 0:
    if (in_R8D == 0) {
      memcpy(puVar1 + 4,in_RSI,0x28);
    }
    else {
      pcVar4 = strdup(*(char **)in_RSI);
      *(char **)(puVar1 + 4) = pcVar4;
      pcVar4 = strdup(*(char **)(in_RSI + 2));
      *(char **)(puVar1 + 6) = pcVar4;
      puVar1[8] = in_RSI[4];
      puVar1[9] = in_RSI[5];
      pvVar3 = INT_CMmalloc((size_t)in_stack_ffffffffffffff60);
      *(void **)(puVar1 + 10) = pvVar3;
      for (local_3c = 0; local_3c < (int)in_RSI[5]; local_3c = local_3c + 1) {
        plVar2 = (long *)(*(long *)(in_RSI + 6) + (long)local_3c * 0x10);
        if (*plVar2 == 0) {
          local_90 = (char *)0x0;
        }
        else {
          local_90 = strdup((char *)*plVar2);
        }
        *(char **)(*(long *)(puVar1 + 10) + (long)local_3c * 0x10) = local_90;
        if (plVar2[1] == 0) {
          local_98 = (char *)0x0;
        }
        else {
          local_98 = strdup((char *)plVar2[1]);
        }
        *(char **)(*(long *)(puVar1 + 10) + (long)local_3c * 0x10 + 8) = local_98;
      }
      pvVar3 = INT_CMmalloc((size_t)in_stack_ffffffffffffff60);
      *(void **)(puVar1 + 0xc) = pvVar3;
      for (local_3c = 0; local_3c < (int)in_RSI[4]; local_3c = local_3c + 1) {
        plVar2 = (long *)(*(long *)(in_RSI + 8) + (long)local_3c * 0x10);
        if (*plVar2 == 0) {
          in_stack_ffffffffffffff60 = (CManager_conflict)0x0;
        }
        else {
          in_stack_ffffffffffffff60 = (CManager_conflict)strdup((char *)*plVar2);
        }
        *(CManager_conflict *)(*(long *)(puVar1 + 0xc) + (long)local_3c * 0x10) =
             in_stack_ffffffffffffff60;
        if (plVar2[1] == 0) {
          local_a8 = (char *)0x0;
        }
        else {
          local_a8 = strdup((char *)plVar2[1]);
        }
        *(char **)(*(long *)(puVar1 + 0xc) + (long)local_3c * 0x10 + 8) = local_a8;
      }
    }
    break;
  case 1:
    *(undefined8 *)(puVar1 + 4) = *(undefined8 *)in_RSI;
    break;
  case 2:
    puVar1[4] = *in_RSI;
    break;
  case 3:
    puVar1[4] = *in_RSI;
    break;
  case 4:
    *(undefined8 *)(puVar1 + 4) = *(undefined8 *)in_RSI;
    *(undefined8 *)(puVar1 + 6) = *(undefined8 *)(in_RSI + 2);
    *(undefined8 *)(puVar1 + 8) = *(undefined8 *)(in_RSI + 4);
    if (in_R8D != 0) {
      pvVar3 = INT_CMmalloc((size_t)in_stack_ffffffffffffff60);
      *(void **)(puVar1 + 8) = pvVar3;
      for (local_74 = 0; (long)local_74 < *(long *)(in_RSI + 2); local_74 = local_74 + 1) {
        *(undefined8 *)(*(long *)(puVar1 + 8) + (long)local_74 * 0x10) =
             *(undefined8 *)(*(long *)(in_RSI + 4) + (long)local_74 * 0x10);
        pcVar4 = strdup(*(char **)(*(long *)(in_RSI + 4) + (long)local_74 * 0x10 + 8));
        *(char **)(*(long *)(puVar1 + 8) + (long)local_74 * 0x10 + 8) = pcVar4;
      }
    }
    break;
  default:
    printf("MEssage type bad, value is %d  %d\n",(ulong)in_EDX,(ulong)*puVar1);
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                  ,0x995,
                  "void queue_master_msg(EVmaster, void *, EVmaster_msg_type, CMConnection, int)");
  }
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  if (in_RDI[4] == 0) {
    in_RDI[4] = (long)puVar1;
  }
  else {
    for (local_80 = in_RDI[4]; *(long *)(local_80 + 0x38) != 0;
        local_80 = *(long *)(local_80 + 0x38)) {
    }
    *(uint **)(local_80 + 0x38) = puVar1;
  }
  if (*(long *)(*(long *)(*in_RDI + 0x20) + 0xf0) == 0) {
    handle_queued_messages(unaff_retaddr,in_RDI);
  }
  else {
    CMwake_server_thread(in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

static void
queue_master_msg(EVmaster master, void*vmsg, EVmaster_msg_type msg_type, CMConnection conn, int copy)
{
    EVmaster_msg_ptr msg = malloc(sizeof(EVmaster_msg));
    msg->msg_type = msg_type;
    msg->conn = conn;
    switch(msg_type) {
    case DFGnode_join: {
	EVnode_join_ptr in = (EVnode_join_ptr)vmsg;
	if (!copy) {
	    msg->u.node_join = *in;
	} else {
	    int i;
	    msg->u.node_join.node_name = strdup(in->node_name);
	    msg->u.node_join.contact_string = strdup(in->contact_string);
	    msg->u.node_join.source_count = in->source_count;
	    msg->u.node_join.sink_count = in->sink_count;
	    msg->u.node_join.sinks = (leaf_element*)malloc(sizeof(leaf_element) * in->sink_count);
	    for (i=0; i < in->sink_count; i++) {
		leaf_element *l = &in->sinks[i];
		msg->u.node_join.sinks[i].name = l->name ? strdup(l->name) : NULL;
		msg->u.node_join.sinks[i].FMtype = l->FMtype ? strdup(l->FMtype) : NULL;
	    }
	    msg->u.node_join.sources = (leaf_element*)malloc(sizeof(leaf_element) * in->source_count);
	    for (i=0; i < in->source_count; i++) {
		leaf_element *l = &in->sources[i];
		msg->u.node_join.sources[i].name = l->name ? strdup(l->name) : NULL;
		msg->u.node_join.sources[i].FMtype = l->FMtype ? strdup(l->FMtype) : NULL;
	    }
	}
	break;
    }
    case DFGdeploy_ack: {
	EVdeploy_ack_ptr in = (EVdeploy_ack_ptr)vmsg;
	msg->u.deploy_ack = *in;
	break;
    }
    case DFGshutdown_contrib: {
	EVshutdown_contribution_ptr in = (EVshutdown_contribution_ptr)vmsg;
	msg->u.shutdown_contrib = *in;
	break;
    }
    case  DFGconn_shutdown: {
	EVconn_shutdown_ptr in = (EVconn_shutdown_ptr)vmsg;
	msg->u.conn_shutdown = *in;
	break;
    }
    case DFGflush_reconfig: {
	EVflush_attrs_reconfig_ptr in = (EVflush_attrs_reconfig_ptr)vmsg;
	msg->u.flush_reconfig = *in;
	if (copy) {
	    int i;
	    msg->u.flush_reconfig.attr_stone_list = malloc(sizeof(EVattr_stone_struct) * in->count);
	    for (i=0 ; i < in->count; i++) {
		msg->u.flush_reconfig.attr_stone_list[i].stone = in->attr_stone_list[i].stone;
		msg->u.flush_reconfig.attr_stone_list[i].attr_str = strdup(in->attr_stone_list[i].attr_str);
	    }
	}
	break;
    }
    default:
	printf("MEssage type bad, value is %d  %d\n", msg_type, msg->msg_type);
	assert(FALSE);
    }
    msg->next = NULL;
    if (master->queued_messages == NULL) {
	master->queued_messages = msg;
    } else {
	EVmaster_msg_ptr last = master->queued_messages;
	while (last->next != NULL) last = last->next;
	last->next = msg;
    }
    if (master->cm->control_list->server_thread != 0) {
	CMwake_server_thread(master->cm);
    } else {
	handle_queued_messages(master->cm, master);
    }
}